

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_complex_sqrt(sexp ctx,sexp z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  sexp psVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  sexp res;
  sexp local_40;
  undefined1 local_38 [16];
  sexp_gc_var_t local_20;
  
  dVar1 = sexp_to_double(ctx,(z->value).type.name);
  dVar2 = sexp_to_double(ctx,(z->value).type.cpl);
  local_20.var = &local_40;
  local_40 = (sexp)0x43e;
  local_20.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_20;
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = dVar2;
  local_38._12_4_ = extraout_XMM0_Dd;
  dVar2 = SQRT(dVar1 * dVar1 + dVar2 * dVar2);
  local_40 = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)&DAT_00000001);
  dVar3 = (dVar1 + dVar2) * 0.5;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  psVar4 = sexp_make_flonum(ctx,dVar3);
  (local_40->value).type.name = psVar4;
  dVar1 = (dVar2 - dVar1) * 0.5;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  psVar4 = sexp_make_flonum(ctx,(double)(~-(ulong)((double)local_38._0_8_ < 0.0) & (ulong)dVar1 |
                                        (ulong)-dVar1 & -(ulong)((double)local_38._0_8_ < 0.0)));
  (local_40->value).type.cpl = psVar4;
  (ctx->value).context.saves = local_20.next;
  return local_40;
}

Assistant:

sexp sexp_complex_sqrt (sexp ctx, sexp z) {
  double x = sexp_to_double(ctx, sexp_complex_real(z)),
    y = sexp_to_double(ctx, sexp_complex_imag(z)), r;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  r = sqrt(x*x + y*y);
  res = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(res) = sexp_make_flonum(ctx, sqrt((x+r)/2));
  sexp_complex_imag(res) = sexp_make_flonum(ctx, ((y<-0.0)?-1:1)*sqrt((-x+r)/2));
  sexp_gc_release1(ctx);
  return res;
}